

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O0

optional<cmWindowsRegistry::View> __thiscall
cmWindowsRegistry::ToView(cmWindowsRegistry *this,string_view name)

{
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>
  *this_00;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_true>
  local_198;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_true>
  local_190;
  iterator it;
  string_view local_180;
  View local_16c;
  string_view local_168;
  View local_154;
  string_view local_150;
  View local_13c;
  string_view local_138;
  View local_124;
  string_view local_120;
  View local_10c;
  string_view local_108;
  View local_f8 [4];
  string_view local_e8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>
  local_d8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>
  local_c0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>
  local_a8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>
  local_90;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>
  local_78;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>
  local_60;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>
  local_48;
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  string_view name_local;
  
  name_local._M_len = name._M_len;
  local_20 = (undefined1  [8])this;
  if (ToView(std::basic_string_view<char,std::char_traits<char>>)::ViewDefinitions == '\0') {
    iVar2 = __cxa_guard_acquire(&ToView(std::basic_string_view<char,std::char_traits<char>>)::
                                 ViewDefinitions,name_local._M_len,name._M_str);
    if (iVar2 != 0) {
      local_e8 = (string_view)::cm::operator____s("BOTH",4);
      local_f8[0] = Both;
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>::
      pair<cm::static_string_view,_cmWindowsRegistry::View,_true>
                (&local_d8,(static_string_view *)&local_e8,local_f8);
      local_108 = (string_view)::cm::operator____s("HOST",4);
      local_10c = Host;
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>::
      pair<cm::static_string_view,_cmWindowsRegistry::View,_true>
                (&local_c0,(static_string_view *)&local_108,&local_10c);
      local_120 = (string_view)::cm::operator____s("TARGET",6);
      local_124 = Target;
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>::
      pair<cm::static_string_view,_cmWindowsRegistry::View,_true>
                (&local_a8,(static_string_view *)&local_120,&local_124);
      local_138 = (string_view)::cm::operator____s("32",2);
      local_13c = Reg32;
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>::
      pair<cm::static_string_view,_cmWindowsRegistry::View,_true>
                (&local_90,(static_string_view *)&local_138,&local_13c);
      local_150 = (string_view)::cm::operator____s("64",2);
      local_154 = Reg64;
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>::
      pair<cm::static_string_view,_cmWindowsRegistry::View,_true>
                (&local_78,(static_string_view *)&local_150,&local_154);
      local_168 = (string_view)::cm::operator____s("32_64",5);
      local_16c = Reg32_64;
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>::
      pair<cm::static_string_view,_cmWindowsRegistry::View,_true>
                (&local_60,(static_string_view *)&local_168,&local_16c);
      local_180 = (string_view)::cm::operator____s("64_32",5);
      it.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_true>
      ._M_cur._4_4_ = 3;
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>::
      pair<cm::static_string_view,_cmWindowsRegistry::View,_true>
                (&local_48,(static_string_view *)&local_180,
                 (View *)((long)&it.
                                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_true>
                                 ._M_cur + 4));
      local_30 = &local_d8;
      local_28 = 7;
      this_00 = (allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>
                 *)((long)&it.
                           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_true>
                           ._M_cur + 1);
      std::
      allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>
      ::allocator(this_00);
      __l._M_len = local_28;
      __l._M_array = local_30;
      std::
      unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>_>
      ::unordered_map(&ToView::ViewDefinitions,__l,0,
                      (hasher *)
                      ((long)&it.
                              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_true>
                              ._M_cur + 3),
                      (key_equal *)
                      ((long)&it.
                              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_true>
                              ._M_cur + 2),this_00);
      std::
      allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>
      ::~allocator((allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>
                    *)((long)&it.
                              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_true>
                              ._M_cur + 1));
      __cxa_atexit(std::
                   unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>_>
                   ::~unordered_map,&ToView::ViewDefinitions,&__dso_handle);
      __cxa_guard_release(&ToView(std::basic_string_view<char,std::char_traits<char>>)::
                           ViewDefinitions);
    }
  }
  local_190._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>_>
       ::find(&ToView::ViewDefinitions,(key_type *)local_20);
  local_198._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>_>_>
       ::end(&ToView::ViewDefinitions);
  bVar1 = std::__detail::operator==(&local_190,&local_198);
  if (bVar1) {
    std::optional<cmWindowsRegistry::View>::optional
              ((optional<cmWindowsRegistry::View> *)&name_local._M_str);
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_cmWindowsRegistry::View>,_false,_true>
                           *)&local_190);
    std::optional<cmWindowsRegistry::View>::optional<cmWindowsRegistry::View_&,_true>
              ((optional<cmWindowsRegistry::View> *)&name_local._M_str,&ppVar3->second);
  }
  return (_Optional_base<cmWindowsRegistry::View,_true,_true>)
         (_Optional_base<cmWindowsRegistry::View,_true,_true>)name_local._M_str;
}

Assistant:

cm::optional<cmWindowsRegistry::View> cmWindowsRegistry::ToView(
  cm::string_view name)
{
  static std::unordered_map<cm::string_view, cmWindowsRegistry::View>
    ViewDefinitions{
      { "BOTH"_s, View::Both },     { "HOST"_s, View::Host },
      { "TARGET"_s, View::Target }, { "32"_s, View::Reg32 },
      { "64"_s, View::Reg64 },      { "32_64"_s, View::Reg32_64 },
      { "64_32"_s, View::Reg64_32 }
    };

  auto it = ViewDefinitions.find(name);

  return it == ViewDefinitions.end()
    ? cm::nullopt
    : cm::optional<cmWindowsRegistry::View>{ it->second };
}